

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getchaintips(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8b0;
  _Manager_type in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8c8;
  pointer in_stack_fffffffffffff8d8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff8e0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff8e8;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff8f0;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff910;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff930;
  pointer pRVar11;
  pointer pRVar12;
  allocator<char> local_6a2;
  allocator<char> local_6a1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_6a0;
  allocator<char> local_682;
  allocator<char> local_681;
  vector<RPCResult,_std::allocator<RPCResult>_> local_680;
  allocator<char> local_662;
  allocator<char> local_661;
  RPCResults local_660;
  vector<RPCArg,_std::allocator<RPCArg>_> local_648;
  allocator<char> local_622;
  allocator<char> local_621;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  char *local_540;
  size_type local_538;
  char local_530 [8];
  undefined8 uStack_528;
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  RPCResult local_420 [4];
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getchaintips",&local_621);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "Return information about all known tips in the block tree, including the main chain as well as orphaned branches.\n"
             ,&local_622);
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_661);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_662);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_681);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_682);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"height",&local_6a1);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"height of the chain tip",&local_6a2)
  ;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description._M_string_length = in_stack_fffffffffffff8c0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description.field_2 = in_stack_fffffffffffff8c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff8e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff8d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_420,NUM,m_key_name,description,inner,SUB81(local_440,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,"hash",(allocator<char> *)&stack0xfffffffffffff937);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,"block hash of the tip",(allocator<char> *)&stack0xfffffffffffff936);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_00._M_string_length = in_stack_fffffffffffff8c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_00.field_2 = in_stack_fffffffffffff8c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult
            (local_420 + 1,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(local_480,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,"branchlen",(allocator<char> *)&stack0xfffffffffffff917);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,
             "zero for main chain, otherwise length of branch connecting the tip to the main chain",
             (allocator<char> *)&stack0xfffffffffffff916);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_01._M_string_length = in_stack_fffffffffffff8c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_01.field_2 = in_stack_fffffffffffff8c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_420 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_4c0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,"status",(allocator<char> *)&stack0xfffffffffffff8f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,
             "status of the chain, \"active\" for the main chain\nPossible values for status:\n1.  \"invalid\"               This branch contains at least one invalid block\n2.  \"headers-only\"          Not all blocks for this branch are available, but the headers are valid\n3.  \"valid-headers\"         All blocks are available for this branch, but they were never fully validated\n4.  \"valid-fork\"            This branch is not part of the active chain, but is fully validated\n5.  \"active\"                This is the tip of the active main chain, which is certainly valid"
             ,(allocator<char> *)&stack0xfffffffffffff8f6);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_02._M_string_length = in_stack_fffffffffffff8c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_420 + 3,STR,m_key_name_02,description_02,inner_02,false);
  __l._M_len = 4;
  __l._M_array = local_420;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_6a0,__l,(allocator_type *)&stack0xfffffffffffff8d7);
  m_key_name_03._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_03._M_string_length = in_stack_fffffffffffff8c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_1c0,OBJ,m_key_name_03,description_03,inner_03,SUB81(local_1e0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_680,__l_00,(allocator_type *)&stack0xfffffffffffff8d6);
  m_key_name_04._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_04._M_string_length = in_stack_fffffffffffff8c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_04.field_2 = in_stack_fffffffffffff8c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_f8,ARR,m_key_name_04,description_04,inner_04,SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a0;
  result._0_8_ = in_stack_fffffffffffff898;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8b0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff8c8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff8f0;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_660,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"getchaintips",(allocator<char> *)&stack0xfffffffffffff8d5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"",(allocator<char> *)&stack0xfffffffffffff8d4);
  HelpExampleCli(&local_580,&local_5a0,&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"getchaintips",(allocator<char> *)&stack0xfffffffffffff8d3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"",(allocator<char> *)&stack0xfffffffffffff8d2);
  HelpExampleRpc(&local_5e0,&local_600,&local_620);
  std::operator+(&local_560,&local_580,&local_5e0);
  local_540 = local_530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p == &local_560.field_2) {
    uStack_528 = local_560.field_2._8_8_;
  }
  else {
    local_540 = local_560._M_dataplus._M_p;
  }
  local_538 = local_560._M_string_length;
  local_560._M_string_length = 0;
  local_560.field_2._M_local_buf[0] = '\0';
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1493:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1493:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff8c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8f0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff910;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff930;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8a0,&stack0xfffffffffffff8a8)),
             description_05,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8a8);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_680);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6a0);
  lVar1 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_420[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_500);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_4c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_480);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff938);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchaintips()
{
    return RPCHelpMan{"getchaintips",
                "Return information about all known tips in the block tree,"
                " including the main chain as well as orphaned branches.\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {{RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::NUM, "height", "height of the chain tip"},
                            {RPCResult::Type::STR_HEX, "hash", "block hash of the tip"},
                            {RPCResult::Type::NUM, "branchlen", "zero for main chain, otherwise length of branch connecting the tip to the main chain"},
                            {RPCResult::Type::STR, "status", "status of the chain, \"active\" for the main chain\n"
            "Possible values for status:\n"
            "1.  \"invalid\"               This branch contains at least one invalid block\n"
            "2.  \"headers-only\"          Not all blocks for this branch are available, but the headers are valid\n"
            "3.  \"valid-headers\"         All blocks are available for this branch, but they were never fully validated\n"
            "4.  \"valid-fork\"            This branch is not part of the active chain, but is fully validated\n"
            "5.  \"active\"                This is the tip of the active main chain, which is certainly valid"},
                        }}}},
                RPCExamples{
                    HelpExampleCli("getchaintips", "")
            + HelpExampleRpc("getchaintips", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    CChain& active_chain = chainman.ActiveChain();

    /*
     * Idea: The set of chain tips is the active chain tip, plus orphan blocks which do not have another orphan building off of them.
     * Algorithm:
     *  - Make one pass through BlockIndex(), picking out the orphan blocks, and also storing a set of the orphan block's pprev pointers.
     *  - Iterate through the orphan blocks. If the block isn't pointed to by another orphan, it is a chain tip.
     *  - Add the active chain tip
     */
    std::set<const CBlockIndex*, CompareBlocksByHeight> setTips;
    std::set<const CBlockIndex*> setOrphans;
    std::set<const CBlockIndex*> setPrevs;

    for (const auto& [_, block_index] : chainman.BlockIndex()) {
        if (!active_chain.Contains(&block_index)) {
            setOrphans.insert(&block_index);
            setPrevs.insert(block_index.pprev);
        }
    }

    for (std::set<const CBlockIndex*>::iterator it = setOrphans.begin(); it != setOrphans.end(); ++it) {
        if (setPrevs.erase(*it) == 0) {
            setTips.insert(*it);
        }
    }

    // Always report the currently active tip.
    setTips.insert(active_chain.Tip());

    /* Construct the output array.  */
    UniValue res(UniValue::VARR);
    for (const CBlockIndex* block : setTips) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("height", block->nHeight);
        obj.pushKV("hash", block->phashBlock->GetHex());

        const int branchLen = block->nHeight - active_chain.FindFork(block)->nHeight;
        obj.pushKV("branchlen", branchLen);

        std::string status;
        if (active_chain.Contains(block)) {
            // This block is part of the currently active chain.
            status = "active";
        } else if (block->nStatus & BLOCK_FAILED_MASK) {
            // This block or one of its ancestors is invalid.
            status = "invalid";
        } else if (!block->HaveNumChainTxs()) {
            // This block cannot be connected because full block data for it or one of its parents is missing.
            status = "headers-only";
        } else if (block->IsValid(BLOCK_VALID_SCRIPTS)) {
            // This block is fully validated, but no longer part of the active chain. It was probably the active block once, but was reorganized.
            status = "valid-fork";
        } else if (block->IsValid(BLOCK_VALID_TREE)) {
            // The headers for this block are valid, but it has not been validated. It was probably never part of the most-work chain.
            status = "valid-headers";
        } else {
            // No clue.
            status = "unknown";
        }
        obj.pushKV("status", status);

        res.push_back(std::move(obj));
    }

    return res;
},
    };
}